

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

StructuralComponent * __thiscall
ASDCP::MXF::StructuralComponent::WriteToTLVSet(StructuralComponent *this,TLVWriter *TLVSet)

{
  bool bVar1;
  int iVar2;
  MDDEntry *Object;
  MDDEntry *pMVar3;
  MDDEntry *in_RDX;
  TLVWriter local_108;
  TLVWriter local_a0;
  undefined1 local_21;
  MDDEntry *local_20;
  TLVWriter *TLVSet_local;
  StructuralComponent *this_local;
  Result_t *result;
  
  TLVSet_local = TLVSet;
  this_local = this;
  if (TLVSet[1].super_MemIOWriter.m_p == (byte_t *)0x0) {
    __assert_fail("m_Dict",
                  "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                  ,0x3dd,
                  "virtual ASDCP::Result_t ASDCP::MXF::StructuralComponent::WriteToTLVSet(TLVWriter &)"
                 );
  }
  local_21 = 0;
  local_20 = in_RDX;
  InterchangeObject::WriteToTLVSet(&this->super_InterchangeObject,TLVSet);
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  pMVar3 = local_20;
  if (-1 < iVar2) {
    Object = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_StructuralComponent_DataDefinition);
    TLVWriter::WriteObject(&local_a0,pMVar3,(IArchive *)Object);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_a0);
    Kumu::Result_t::~Result_t((Result_t *)&local_a0);
  }
  iVar2 = Kumu::Result_t::operator_cast_to_int((Result_t *)this);
  if ((-1 < iVar2) &&
     (bVar1 = optional_property<unsigned_long_long>::empty
                        ((optional_property<unsigned_long_long> *)
                         &TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_right), !bVar1)) {
    pMVar3 = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                              MDD_StructuralComponent_Duration);
    optional_property<unsigned_long_long>::get
              ((optional_property<unsigned_long_long> *)
               &TLVSet[2].m_ElementMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    TLVWriter::WriteUi64(&local_108,local_20,(ui64_t *)pMVar3);
    Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_108);
    Kumu::Result_t::~Result_t((Result_t *)&local_108);
  }
  return this;
}

Assistant:

ASDCP::Result_t
StructuralComponent::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = InterchangeObject::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteObject(OBJ_WRITE_ARGS(StructuralComponent, DataDefinition));
  if ( ASDCP_SUCCESS(result)  && ! Duration.empty() ) result = TLVSet.WriteUi64(OBJ_WRITE_ARGS_OPT(StructuralComponent, Duration));
  return result;
}